

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O3

int32_t __thiscall
DeviceTy::data_submit(DeviceTy *this,void *TgtPtrBegin,void *HstPtrBegin,int64_t Size)

{
  int32_t iVar1;
  OmptInterface *this_00;
  
  ompt_interface::__tls_init();
  this_00 = (OmptInterface *)__tls_get_addr(&PTR_0010ffa8);
  OmptInterface::target_data_submit_begin(this_00,(long)this->DeviceID,TgtPtrBegin,HstPtrBegin,Size)
  ;
  iVar1 = (*(code *)this->RTL->data_submit)(this->RTLDeviceID,TgtPtrBegin,HstPtrBegin,Size);
  ompt_interface::__tls_init();
  OmptInterface::target_data_submit_end(this_00,(long)this->DeviceID,TgtPtrBegin,HstPtrBegin,Size);
  return iVar1;
}

Assistant:

int32_t DeviceTy::data_submit(void *TgtPtrBegin, void *HstPtrBegin,
    int64_t Size) {
  DP("enter DeviceTy::data_submit\n");
  ompt_interface.target_data_submit_begin(DeviceID, TgtPtrBegin, HstPtrBegin, Size);
  int32_t result = RTL->data_submit(RTLDeviceID, TgtPtrBegin, HstPtrBegin, Size); 
  ompt_interface.target_data_submit_end(DeviceID, TgtPtrBegin, HstPtrBegin, Size);
  DP("exit DeviceTy::data_submit\n");
  return result;
}